

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

Light * embree::ISPCScene::convertLight(Ref<embree::SceneGraph::LightNode> *in)

{
  LightNode *pLVar1;
  Light *out;
  Ref<embree::SceneGraph::LightNode> local_28;
  Ref<embree::SceneGraph::LightNode> local_20;
  
  pLVar1 = in->ptr;
  local_20.ptr = pLVar1;
  if (pLVar1 != (LightNode *)0x0) {
    (*(pLVar1->super_Node).super_RefCount._vptr_RefCount[2])(pLVar1);
  }
  out = createLight(&local_20);
  if (pLVar1 != (LightNode *)0x0) {
    (*(pLVar1->super_Node).super_RefCount._vptr_RefCount[3])(pLVar1);
  }
  (*(in->ptr->super_Node).super_RefCount._vptr_RefCount[0x12])(0,&local_28);
  updateLight(&local_28,out);
  if (local_28.ptr != (LightNode *)0x0) {
    (*((local_28.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return out;
}

Assistant:

Light* ISPCScene::convertLight(Ref<SceneGraph::LightNode> in)
  {
    Light* l = createLight(in);
    updateLight(in->get(0.0f),l);
    return l;
  }